

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O1

void __thiscall
Imf_2_5::DwaCompressor::LossyDctDecoder::LossyDctDecoder
          (LossyDctDecoder *this,vector<char_*,_std::allocator<char_*>_> *rowPtrs,char *packedAc,
          char *packedDc,unsigned_short *toLinear,int width,int height,PixelType type)

{
  iterator __position;
  
  (this->super_LossyDctDecoderBase)._vptr_LossyDctDecoderBase =
       (_func_int **)&PTR__LossyDctDecoderBase_0300ca40;
  (this->super_LossyDctDecoderBase)._isNativeXdr = false;
  (this->super_LossyDctDecoderBase)._packedAcCount = 0;
  (this->super_LossyDctDecoderBase)._packedDcCount = 0;
  (this->super_LossyDctDecoderBase)._packedAc = packedAc;
  (this->super_LossyDctDecoderBase)._packedDc = packedDc;
  (this->super_LossyDctDecoderBase)._toLinear = toLinear;
  (this->super_LossyDctDecoderBase)._width = width;
  (this->super_LossyDctDecoderBase)._height = height;
  (this->super_LossyDctDecoderBase)._rowPtrs.
  super__Vector_base<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_LossyDctDecoderBase)._rowPtrs.
  super__Vector_base<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_LossyDctDecoderBase)._rowPtrs.
  super__Vector_base<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_LossyDctDecoderBase)._type.
  super__Vector_base<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_LossyDctDecoderBase)._type.
  super__Vector_base<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_LossyDctDecoderBase)._type.
  super__Vector_base<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_LossyDctDecoderBase)._dctData.
  super__Vector_base<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_LossyDctDecoderBase)._dctData.
  super__Vector_base<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_LossyDctDecoderBase)._dctData.
  super__Vector_base<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (toLinear == (unsigned_short *)0x0) {
    (this->super_LossyDctDecoderBase)._toLinear = (unsigned_short *)dwaCompressorNoOp;
  }
  (this->super_LossyDctDecoderBase)._isNativeXdr = (bool)GLOBAL_SYSTEM_LITTLE_ENDIAN;
  (this->super_LossyDctDecoderBase)._vptr_LossyDctDecoderBase =
       (_func_int **)&PTR__LossyDctDecoderBase_0300cbb0;
  std::
  vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
  ::push_back(&(this->super_LossyDctDecoderBase)._rowPtrs,rowPtrs);
  __position._M_current =
       (this->super_LossyDctDecoderBase)._type.
       super__Vector_base<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->super_LossyDctDecoderBase)._type.
      super__Vector_base<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Imf_2_5::PixelType,std::allocator<Imf_2_5::PixelType>>::
    _M_realloc_insert<Imf_2_5::PixelType_const&>
              ((vector<Imf_2_5::PixelType,std::allocator<Imf_2_5::PixelType>> *)
               &(this->super_LossyDctDecoderBase)._type,__position,&type);
  }
  else {
    *__position._M_current = type;
    (this->super_LossyDctDecoderBase)._type.
    super__Vector_base<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

LossyDctDecoder
        (std::vector<char *> &rowPtrs,
         char *packedAc,
         char *packedDc,
         const unsigned short *toLinear,
         int width,
         int height,
         PixelType type)
    :
        LossyDctDecoderBase(packedAc, packedDc, toLinear, width, height)
    {
        _rowPtrs.push_back(rowPtrs);
        _type.push_back(type);
    }